

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf128.c
# Opt level: O2

void cf_gf128_double_le(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  uint32_t in_EDX;
  uint uVar4;
  uint8_t table [2];
  uint8_t local_12 [2];
  
  uVar1 = *in;
  uVar4 = uVar1 >> 1;
  *out = uVar4;
  uVar2 = in[1];
  out[1] = uVar1 << 0x1f | uVar2 >> 1;
  uVar1 = in[2];
  out[2] = uVar2 << 0x1f | uVar1 >> 1;
  uVar2 = in[3];
  out[3] = uVar1 << 0x1f | uVar2 >> 1;
  bVar3 = select_u8(uVar2 & 1,local_12,in_EDX);
  *out = (uint)bVar3 << 0x18 ^ uVar4;
  return;
}

Assistant:

void cf_gf128_double_le(const cf_gf128 in, cf_gf128 out)
{
  uint8_t table[2] = { 0x00, 0xe1 };
  uint32_t borrow = 0;
  uint32_t inword;

  inword = in[0];   out[0] = (inword >> 1) | (borrow << 31);  borrow = inword & 1;
  inword = in[1];   out[1] = (inword >> 1) | (borrow << 31);  borrow = inword & 1;
  inword = in[2];   out[2] = (inword >> 1) | (borrow << 31);  borrow = inword & 1;
  inword = in[3];   out[3] = (inword >> 1) | (borrow << 31);  borrow = inword & 1;

#if CF_CACHE_SIDE_CHANNEL_PROTECTION
  out[0] ^= select_u8(borrow, table, 2) << 24;
#else
  out[0] ^= table[borrow] << 24;
#endif
}